

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int local_38;
  int local_34;
  int w;
  int i;
  uint *pRes1;
  uint *pRes0;
  Vec_Ptr_t *vInfoCos_local;
  Vec_Ptr_t *vInfoCis_local;
  Cec_ManSim_t *p_local;
  
  if ((p->pPars->fSeqSimulate == 0) || (iVar1 = Gia_ManRegNum(p->pAig), iVar1 < 1)) {
    for (local_34 = 0; iVar1 = Gia_ManCiNum(p->pAig), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar3 = Vec_PtrEntry(vInfoCis,local_34);
      for (local_38 = 0; local_38 < p->nWords; local_38 = local_38 + 1) {
        uVar2 = Gia_ManRandom(0);
        *(uint *)((long)pvVar3 + (long)local_38 * 4) = uVar2;
      }
    }
  }
  else {
    if ((vInfoCis == (Vec_Ptr_t *)0x0) || (vInfoCos == (Vec_Ptr_t *)0x0)) {
      __assert_fail("vInfoCis && vInfoCos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                    ,0x32e,"void Cec_ManSimCreateInfo(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    for (local_34 = 0; iVar1 = Gia_ManPiNum(p->pAig), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar3 = Vec_PtrEntry(vInfoCis,local_34);
      for (local_38 = 0; local_38 < p->nWords; local_38 = local_38 + 1) {
        uVar2 = Gia_ManRandom(0);
        *(uint *)((long)pvVar3 + (long)local_38 * 4) = uVar2;
      }
    }
    for (local_34 = 0; iVar1 = Gia_ManRegNum(p->pAig), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Gia_ManPiNum(p->pAig);
      pvVar3 = Vec_PtrEntry(vInfoCis,iVar1 + local_34);
      iVar1 = Gia_ManPoNum(p->pAig);
      pvVar4 = Vec_PtrEntry(vInfoCos,iVar1 + local_34);
      for (local_38 = 0; local_38 < p->nWords; local_38 = local_38 + 1) {
        *(undefined4 *)((long)pvVar3 + (long)local_38 * 4) =
             *(undefined4 *)((long)pvVar4 + (long)local_38 * 4);
      }
    }
  }
  return;
}

Assistant:

void Cec_ManSimCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    if ( p->pPars->fSeqSimulate && Gia_ManRegNum(p->pAig) > 0 )
    {
        assert( vInfoCis && vInfoCos );
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, Gia_ManPiNum(p->pAig) + i );
            pRes1 = (unsigned *)Vec_PtrEntry( vInfoCos, Gia_ManPoNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = pRes1[w];
        }
    }
    else 
    {
        for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
    }
}